

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswAig.c
# Opt level: O1

Aig_Man_t * Ssw_FramesWithClasses(Ssw_Man_t *p)

{
  void *pvVar1;
  Vec_Int_t *pVVar2;
  uint uVar3;
  Aig_Man_t *p_00;
  Aig_Obj_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  ulong uVar6;
  Aig_Man_t *pAVar7;
  uint uVar8;
  Aig_Obj_t *p1;
  int iVar9;
  int iVar10;
  Aig_Obj_t *pAVar11;
  uint uVar12;
  long lVar13;
  
  if (p->pFrames != (Aig_Man_t *)0x0) {
    __assert_fail("p->pFrames == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x95,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  pAVar7 = p->pAig;
  if (pAVar7->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x96,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  if (pAVar7->nObjs[2] <= pAVar7->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0x97,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  p->nConstrTotal = 0;
  p->nConstrReduced = 0;
  p_00 = Aig_ManStart(p->nFrames * pAVar7->vObjs->nSize);
  pAVar7 = p->pAig;
  if (0 < pAVar7->nRegs) {
    iVar9 = 0;
    do {
      uVar8 = pAVar7->nTruePis + iVar9;
      if (((int)uVar8 < 0) || (pAVar7->vCis->nSize <= (int)uVar8)) goto LAB_005da1aa;
      pvVar1 = pAVar7->vCis->pArray[uVar8];
      pAVar4 = Aig_ObjCreateCi(p_00);
      p->pNodeToFrames[(long)*(int *)((long)pvVar1 + 0x24) * (long)p->nFrames] = pAVar4;
      iVar9 = iVar9 + 1;
      pAVar7 = p->pAig;
    } while (iVar9 < pAVar7->nRegs);
  }
  if (p->pPars->nFramesK < 1) {
    uVar8 = 0;
  }
  else {
    uVar8 = 0;
    iVar9 = 0;
    do {
      p->pNodeToFrames[p->pAig->pConst1->Id * p->nFrames + iVar9] = p_00->pConst1;
      pAVar7 = p->pAig;
      if (0 < pAVar7->nTruePis) {
        lVar13 = 0;
        do {
          if (pAVar7->vCis->nSize <= lVar13) goto LAB_005da1aa;
          pvVar1 = pAVar7->vCis->pArray[lVar13];
          pAVar4 = Aig_ObjCreateCi(p_00);
          pVVar2 = p->vInits;
          if (pVVar2 == (Vec_Int_t *)0x0) {
            uVar6 = 0;
          }
          else {
            if (((int)uVar8 < 0) || (pVVar2->nSize <= (int)uVar8)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar6 = (ulong)uVar8;
            uVar8 = uVar8 + 1;
            uVar6 = (ulong)(pVVar2->pArray[uVar6] != 0) << 3;
          }
          *(ulong *)&pAVar4->field_0x18 = *(ulong *)&pAVar4->field_0x18 & 0xfffffffffffffff7 | uVar6
          ;
          p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar9] = pAVar4;
          lVar13 = lVar13 + 1;
          pAVar7 = p->pAig;
        } while (lVar13 < pAVar7->nTruePis);
      }
      pAVar7 = p->pAig;
      if (0 < pAVar7->nRegs) {
        iVar10 = 0;
        do {
          uVar3 = pAVar7->nTruePis + iVar10;
          if (((int)uVar3 < 0) || (pAVar7->vCis->nSize <= (int)uVar3)) goto LAB_005da1aa;
          Ssw_FramesConstrainNode(p,p_00,pAVar7,(Aig_Obj_t *)pAVar7->vCis->pArray[uVar3],iVar9,1);
          iVar10 = iVar10 + 1;
          pAVar7 = p->pAig;
        } while (iVar10 < pAVar7->nRegs);
      }
      pVVar5 = p->pAig->vObjs;
      if (0 < pVVar5->nSize) {
        lVar13 = 0;
        do {
          pAVar4 = (Aig_Obj_t *)pVVar5->pArray[lVar13];
          if ((pAVar4 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar4->field_0x18 & 7) - 7))
          {
            if (((ulong)pAVar4 & 1) != 0) goto LAB_005da1c9;
            uVar6 = (ulong)pAVar4->pFanin0 & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              pAVar11 = (Aig_Obj_t *)0x0;
            }
            else {
              pAVar11 = (Aig_Obj_t *)
                        ((ulong)((uint)pAVar4->pFanin0 & 1) ^
                        (ulong)p->pNodeToFrames[*(int *)(uVar6 + 0x24) * p->nFrames + iVar9]);
            }
            uVar6 = (ulong)pAVar4->pFanin1 & 0xfffffffffffffffe;
            if (uVar6 == 0) {
              p1 = (Aig_Obj_t *)0x0;
            }
            else {
              p1 = (Aig_Obj_t *)
                   ((ulong)((uint)pAVar4->pFanin1 & 1) ^
                   (ulong)p->pNodeToFrames[*(int *)(uVar6 + 0x24) * p->nFrames + iVar9]);
            }
            pAVar11 = Aig_And(p_00,pAVar11,p1);
            p->pNodeToFrames[pAVar4->Id * p->nFrames + iVar9] = pAVar11;
            Ssw_FramesConstrainNode(p,p_00,p->pAig,pAVar4,iVar9,1);
          }
          lVar13 = lVar13 + 1;
          pVVar5 = p->pAig->vObjs;
        } while (lVar13 < pVVar5->nSize);
      }
      pVVar5 = p->pAig->vCos;
      if (0 < pVVar5->nSize) {
        lVar13 = 0;
        do {
          pvVar1 = pVVar5->pArray[lVar13];
          if (((ulong)pvVar1 & 1) != 0) {
LAB_005da1c9:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswInt.h"
                          ,0xb9,"Aig_Obj_t *Ssw_ObjChild0Fra(Ssw_Man_t *, Aig_Obj_t *, int)");
          }
          uVar6 = *(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe;
          if (uVar6 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                     (ulong)p->pNodeToFrames[*(int *)(uVar6 + 0x24) * p->nFrames + iVar9]);
          }
          p->pNodeToFrames[*(int *)((long)pvVar1 + 0x24) * p->nFrames + iVar9] = pAVar4;
          lVar13 = lVar13 + 1;
          pVVar5 = p->pAig->vCos;
        } while (lVar13 < pVVar5->nSize);
      }
      pAVar7 = p->pAig;
      if (0 < pAVar7->nRegs) {
        iVar10 = 0;
        do {
          uVar3 = pAVar7->nTruePos + iVar10;
          if (((((int)uVar3 < 0) || (pAVar7->vCos->nSize <= (int)uVar3)) ||
              (uVar12 = pAVar7->nTruePis + iVar10, (int)uVar12 < 0)) ||
             (pAVar7->vCis->nSize <= (int)uVar12)) goto LAB_005da1aa;
          p->pNodeToFrames
          [p->nFrames * *(int *)((long)pAVar7->vCis->pArray[uVar12] + 0x24) + iVar9 + 1] =
               p->pNodeToFrames
               [*(int *)((long)pAVar7->vCos->pArray[uVar3] + 0x24) * p->nFrames + iVar9];
          iVar10 = iVar10 + 1;
          pAVar7 = p->pAig;
        } while (iVar10 < pAVar7->nRegs);
      }
      iVar9 = iVar9 + 1;
    } while (iVar9 < p->pPars->nFramesK);
  }
  if ((p->vInits != (Vec_Int_t *)0x0) && (p->vInits->nSize != uVar8 + p->pAig->nTruePis)) {
    __assert_fail("p->vInits == NULL || Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xbc,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  pAVar7 = p->pAig;
  if (0 < pAVar7->nRegs) {
    iVar9 = 0;
    do {
      uVar8 = pAVar7->nTruePis + iVar9;
      if (((int)uVar8 < 0) || (pAVar7->vCis->nSize <= (int)uVar8)) {
LAB_005da1aa:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      Aig_ObjCreateCo(p_00,p->pNodeToFrames
                           [(long)*(int *)((long)pAVar7->vCis->pArray[uVar8] + 0x24) *
                            (long)p->nFrames + (long)p->pPars->nFramesK]);
      iVar9 = iVar9 + 1;
      pAVar7 = p->pAig;
    } while (iVar9 < pAVar7->nRegs);
  }
  Aig_ManCleanup(p_00);
  if (p_00->pData != (void *)0x0) {
    __assert_fail("pFrames->pData == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswAig.c"
                  ,0xc4,"Aig_Man_t *Ssw_FramesWithClasses(Ssw_Man_t *)");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Ssw_FramesWithClasses( Ssw_Man_t * p )
{
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    int i, f, iLits;
    assert( p->pFrames == NULL );
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    p->nConstrTotal = p->nConstrReduced = 0;

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFrames );
    // create latches for the first frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Ssw_ObjSetFrame( p, pObj, 0, Aig_ObjCreateCi(pFrames) );
    // add timeframes
    iLits = 0;
    for ( f = 0; f < p->pPars->nFramesK; f++ )
    {
        // map constants and PIs
        Ssw_ObjSetFrame( p, Aig_ManConst1(p->pAig), f, Aig_ManConst1(pFrames) );
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjNew = Aig_ObjCreateCi(pFrames);
            pObjNew->fPhase = (p->vInits != NULL) && Vec_IntEntry(p->vInits, iLits++);
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
        }
        // set the constraints on the latch outputs
        Saig_ManForEachLo( p->pAig, pObj, i )
            Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, f, 1 );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Ssw_ObjChild0Fra(p, pObj, f), Ssw_ObjChild1Fra(p, pObj, f) );
            Ssw_ObjSetFrame( p, pObj, f, pObjNew );
            Ssw_FramesConstrainNode( p, pFrames, p->pAig, pObj, f, 1 );
        }
        // transfer to the primary outputs
        Aig_ManForEachCo( p->pAig, pObj, i )
            Ssw_ObjSetFrame( p, pObj, f, Ssw_ObjChild0Fra(p, pObj,f) );
        // transfer latch input to the latch outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
            Ssw_ObjSetFrame( p, pObjLo, f+1, Ssw_ObjFrame(p, pObjLi,f) );
    }
    assert( p->vInits == NULL || Vec_IntSize(p->vInits) == iLits + Saig_ManPiNum(p->pAig) );
    // add the POs for the latch outputs of the last frame
    Saig_ManForEachLo( p->pAig, pObj, i )
        Aig_ObjCreateCo( pFrames, Ssw_ObjFrame( p, pObj, p->pPars->nFramesK ) );

    // remove dangling nodes
    Aig_ManCleanup( pFrames );
    // make sure the satisfying assignment is node assigned
    assert( pFrames->pData == NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}